

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

bool __thiscall Assimp::ObjFileParser::needsNewMesh(ObjFileParser *this,string *materialName)

{
  uint uVar1;
  uint uVar2;
  pointer pMVar3;
  size_type sVar4;
  int curMatIdx;
  int matIdx;
  bool newMat;
  string *materialName_local;
  ObjFileParser *this_local;
  
  pMVar3 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  if (pMVar3->m_pCurrentMesh == (Mesh *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
    uVar2 = getMaterialIndex(this,materialName);
    pMVar3 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    uVar1 = pMVar3->m_pCurrentMesh->m_uiMaterialIndex;
    if ((uVar1 != 0xffffffff) && (uVar1 != uVar2)) {
      pMVar3 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      sVar4 = std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::size
                        (&pMVar3->m_pCurrentMesh->m_Faces);
      if (sVar4 != 0) {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ObjFileParser::needsNewMesh( const std::string &materialName )
{
    // If no mesh data yet
    if(m_pModel->m_pCurrentMesh == 0)
    {
        return true;
    }
    bool newMat = false;
    int matIdx = getMaterialIndex( materialName );
    int curMatIdx = m_pModel->m_pCurrentMesh->m_uiMaterialIndex;
    if ( curMatIdx != int(ObjFile::Mesh::NoMaterial)
        && curMatIdx != matIdx
        // no need create a new mesh if no faces in current
        // lets say 'usemtl' goes straight after 'g'
        && m_pModel->m_pCurrentMesh->m_Faces.size() > 0 )
    {
        // New material -> only one material per mesh, so we need to create a new
        // material
        newMat = true;
    }
    return newMat;
}